

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::SmallVector<slang::parsing::Token,_2UL>::SmallVector
          (SmallVector<slang::parsing::Token,_2UL> *this,size_type capacity)

{
  (this->super_SmallVectorBase<slang::parsing::Token>).data_ =
       (pointer)(this->super_SmallVectorBase<slang::parsing::Token>).firstElement;
  (this->super_SmallVectorBase<slang::parsing::Token>).len = 0;
  (this->super_SmallVectorBase<slang::parsing::Token>).cap = 2;
  SmallVectorBase<slang::parsing::Token>::reserve
            (&this->super_SmallVectorBase<slang::parsing::Token>,capacity);
  return;
}

Assistant:

explicit SmallVector(size_type capacity, UninitializedTag) : Base(N) {
        this->reserve(capacity);
    }